

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O2

void __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::SetUri(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
         *this)

{
  Ch *pCVar1;
  SizeType SVar2;
  Ch *pCVar3;
  
  pCVar3 = this->uri_;
  pCVar1 = this->base_;
  SVar2 = GetBaseStringLength(this);
  memcpy(pCVar3,pCVar1,(ulong)SVar2);
  SVar2 = GetBaseStringLength(this);
  pCVar3 = pCVar3 + SVar2;
  pCVar1 = this->frag_;
  SVar2 = GetFragStringLength(this);
  memcpy(pCVar3,pCVar1,(ulong)SVar2);
  SVar2 = GetFragStringLength(this);
  pCVar3[SVar2] = '\0';
  return;
}

Assistant:

void SetUri() {
        Ch* next = uri_;
        std::memcpy(next, base_, GetBaseStringLength() * sizeof(Ch));
        next+= GetBaseStringLength();
        std::memcpy(next, frag_, GetFragStringLength() * sizeof(Ch));
        next+= GetFragStringLength();
        *next = '\0';
    }